

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateType.cpp
# Opt level: O0

void __thiscall DIS::AggregateType::AggregateType(AggregateType *this)

{
  AggregateType *this_local;
  
  this->_vptr_AggregateType = (_func_int **)&PTR__AggregateType_002667e8;
  this->_aggregateKind = '\0';
  this->_domain = '\0';
  this->_country = 0;
  this->_category = '\0';
  this->_subcategory = '\0';
  this->_specific = '\0';
  this->_extra = '\0';
  return;
}

Assistant:

AggregateType::AggregateType():
   _aggregateKind(0), 
   _domain(0), 
   _country(0), 
   _category(0), 
   _subcategory(0), 
   _specific(0), 
   _extra(0)
{
}